

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergePartialFromImpl<true>(StringPiece input,MessageLite *msg)

{
  long lVar1;
  long *in_RDX;
  ParseContext ctx;
  char *ptr;
  bool local_91;
  undefined1 local_90 [8];
  StringPiece *in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8b;
  int in_stack_ffffffffffffff8c;
  ParseContext *in_stack_ffffffffffffff90;
  undefined8 local_20;
  
  io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::StringPiece&>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(bool)in_stack_ffffffffffffff8b,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  lVar1 = (**(code **)(*in_RDX + 0x68))(in_RDX,local_20,local_90);
  local_91 = false;
  if (lVar1 != 0) {
    local_91 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_90);
  }
  return local_91;
}

Assistant:

bool MergePartialFromImpl(StringPiece input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  return ptr && ctx.EndedAtLimit();
}